

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O2

void google::glog_internal_namespace_::InitGoogleLoggingUtilities(char *argv0)

{
  char *pcVar1;
  ostream *poVar2;
  LogMessage local_20;
  
  if (g_program_invocation_short_name == (char *)0x0) {
    pcVar1 = strrchr(argv0,0x2f);
    g_program_invocation_short_name = pcVar1 + 1;
    if (pcVar1 == (char *)0x0) {
      g_program_invocation_short_name = argv0;
    }
    InstallFailureFunction(DumpStackTraceAndExit);
    return;
  }
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/utilities.cc"
             ,0x16d);
  poVar2 = LogMessage::stream(&local_20);
  poVar2 = std::operator<<(poVar2,"Check failed: !IsGoogleLoggingInitialized() ");
  std::operator<<(poVar2,"You called InitGoogleLogging() twice!");
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

void InitGoogleLoggingUtilities(const char* argv0) {
  CHECK(!IsGoogleLoggingInitialized())
      << "You called InitGoogleLogging() twice!";
  const char* slash = strrchr(argv0, '/');
#ifdef GLOG_OS_WINDOWS
  if (!slash)  slash = strrchr(argv0, '\\');
#endif
  g_program_invocation_short_name = slash ? slash + 1 : argv0;

#ifdef HAVE_STACKTRACE
  InstallFailureFunction(&DumpStackTraceAndExit);
#endif
}